

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

idx_t __thiscall duckdb::Transformer::ParamCount(Transformer *this)

{
  Transformer *pTVar1;
  reference<const_Transformer> node;
  
  pTVar1 = (this->parent).ptr;
  while (pTVar1 != (Transformer *)0x0) {
    optional_ptr<duckdb::Transformer,_true>::CheckValid(&this->parent);
    this = (this->parent).ptr;
    pTVar1 = (this->parent).ptr;
  }
  return this->prepared_statement_parameter_index;
}

Assistant:

idx_t Transformer::ParamCount() const {
	auto &root = RootTransformer();
	return root.prepared_statement_parameter_index;
}